

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringTest.cpp
# Opt level: O2

void __thiscall StringTest::StringTest(StringTest *this,int number)

{
  char name [32];
  
  TestCase::TestCase(&this->super_TestCase,"StringTest");
  (this->super_TestCase)._vptr_TestCase = (_func_int **)&PTR__TestCase_0010ace8;
  this->mTestNum = number;
  snprintf(name,0x20,"StringTest%d",(ulong)(number + 1));
  name[0x1f] = '\0';
  std::__cxx11::string::assign((char *)&(this->super_TestCase).mTestName);
  return;
}

Assistant:

StringTest( int number ) : 
		TestCase( "StringTest" ), mTestNum( number ) 
	{
		char name[ 32 ];
		snprintf( name, 32, "StringTest%d", number + 1 );
		name[ 31 ] = '\0';
		SetTestName( name );	
	}